

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

text_input_buffer * __thiscall dtc::text_input_buffer::next_token(text_input_buffer *this)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  int iVar1;
  element_type *peVar2;
  bool bVar3;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  int iVar6;
  _Elt_pointer psVar7;
  _Elt_pointer psVar8;
  uint uVar9;
  
  this_00 = &this->input_stack;
  do {
    iVar1 = this->cursor;
    skip_spaces(this);
    bVar3 = finished(this);
    if (bVar3) {
      return this;
    }
    psVar4 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar5 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar5 != psVar4) {
      psVar7 = psVar5;
      if (psVar5 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar7 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar6 = peVar2->cursor;
      if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] == '/')) {
        psVar7 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        psVar8 = psVar5;
        if (psVar5 == psVar7) {
          psVar8 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (((-2 < peVar2->cursor) && (uVar9 = peVar2->cursor + 1, (int)uVar9 < peVar2->size)) &&
           (peVar2->buffer[uVar9] == '*')) {
          if (psVar5 != psVar4) {
            this->cursor = this->cursor + 1;
            if (psVar5 == psVar7) {
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar6 = peVar2->cursor + 1;
            peVar2->cursor = iVar6;
            if (peVar2->size <= iVar6) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
LAB_00134028:
          psVar4 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar4 != (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            this->cursor = this->cursor + 1;
            if (psVar4 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar6 = peVar2->cursor + 1;
            peVar2->cursor = iVar6;
            if (peVar2->size <= iVar6) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          do {
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            bVar3 = psVar4 != (this->input_stack).c.
                              super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur;
            if (bVar3) {
              psVar5 = psVar4;
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar5 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = peVar2->cursor;
              if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] != '\0'))
              {
                if (bVar3) {
                  if (psVar4 == (this->input_stack).c.
                                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    psVar4 = (this->input_stack).c.
                             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                  }
                  peVar2 = psVar4[-1].
                           super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  iVar6 = peVar2->cursor;
                  if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) &&
                     (peVar2->buffer[iVar6] == '*')) goto LAB_001340e7;
                }
                bVar3 = finished(this);
                if (!bVar3) goto LAB_00134028;
              }
            }
LAB_001340e7:
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar4 != (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              this->cursor = this->cursor + 1;
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar4 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = peVar2->cursor + 1;
              peVar2->cursor = iVar6;
              if (peVar2->size <= iVar6) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar5 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar5 == psVar4) goto LAB_001341a6;
            psVar7 = psVar5;
            if (psVar5 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar6 = peVar2->cursor;
            if ((((long)iVar6 < 0) || (peVar2->size <= iVar6)) || (peVar2->buffer[iVar6] == '\0'))
            goto LAB_001341a6;
            if (psVar5 != psVar4) {
              if (psVar5 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar5 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = peVar2->cursor;
              if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] == '/'))
              goto LAB_001341a6;
            }
            bVar3 = finished(this);
            if (bVar3) {
LAB_001341a6:
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (psVar4 != (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                this->cursor = this->cursor + 1;
                if (psVar4 == (this->input_stack).c.
                              super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  psVar4 = (this->input_stack).c.
                           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                peVar2 = psVar4[-1].
                         super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar6 = peVar2->cursor + 1;
                peVar2->cursor = iVar6;
                if (peVar2->size <= iVar6) {
                  std::
                  deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ::pop_back(&this_00->c);
                }
              }
              break;
            }
          } while( true );
        }
      }
    }
    psVar4 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar5 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar5 != psVar4) {
      psVar7 = psVar5;
      if (psVar5 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar7 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar6 = peVar2->cursor;
      if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] == '/')) {
        psVar7 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        psVar8 = psVar5;
        if (psVar5 == psVar7) {
          psVar8 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (((-2 < peVar2->cursor) && (uVar9 = peVar2->cursor + 1, (int)uVar9 < peVar2->size)) &&
           (peVar2->buffer[uVar9] == '/')) {
          if (psVar5 != psVar4) {
            this->cursor = this->cursor + 1;
            if (psVar5 == psVar7) {
              psVar5 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar6 = peVar2->cursor + 1;
            peVar2->cursor = iVar6;
            if (peVar2->size <= iVar6) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          do {
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar4 != (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              this->cursor = this->cursor + 1;
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar4 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = peVar2->cursor + 1;
              peVar2->cursor = iVar6;
              if (peVar2->size <= iVar6) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar4 != (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              if (psVar4 == (this->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar4 = (this->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = peVar2->cursor;
              if (((-1 < (long)iVar6) && (iVar6 < peVar2->size)) && (peVar2->buffer[iVar6] == '\n'))
              break;
            }
            bVar3 = finished(this);
          } while (!bVar3);
          psVar4 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar4 != (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            this->cursor = this->cursor + 1;
            if (psVar4 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar6 = peVar2->cursor + 1;
            peVar2->cursor = iVar6;
            if (peVar2->size <= iVar6) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
        }
      }
    }
    if (iVar1 == this->cursor) {
      return this;
    }
  } while( true );
}

Assistant:

text_input_buffer&
text_input_buffer::next_token()
{
	auto &self = *this;
	int start;
	do {
		start = cursor;
		skip_spaces();
		if (finished())
		{
			return self;
		}
		// Parse /* comments
		if (*self == '/' && peek() == '*')
		{
			// eat the start of the comment
			++self;
			++self;
			do {
				// Find the ending * of */
				while ((*self != '\0') && (*self != '*') && !finished())
				{
					++self;
				}
				// Eat the *
				++self;
			} while ((*self != '\0') && (*self != '/') && !finished());
			// Eat the /
			++self;
		}
		// Parse // comments
		if ((*self == '/' && peek() == '/'))
		{
			// eat the start of the comment
			++self;
			++self;
			// Find the ending of the line
			while (*self != '\n' && !finished())
			{
				++self;
			}
			// Eat the \n
			++self;
		}
	} while (start != cursor);
	return self;
}